

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O3

Result __thiscall wabt::TypeChecker::OnBrTableTarget(TypeChecker *this,Index depth)

{
  _anonymous_namespace_ *this_00;
  _Alloc_hider _Var1;
  Result RVar2;
  char *prefix;
  TypeVector *pTVar3;
  _anonymous_namespace_ *this_01;
  Label *label;
  Label *local_68;
  string local_60;
  string local_40;
  
  RVar2 = GetLabel(this,depth,&local_68);
  prefix = (char *)0x1;
  if (RVar2.enum_ != Error) {
    pTVar3 = &local_68->param_types;
    this_01 = (_anonymous_namespace_ *)&local_68->result_types;
    if (local_68->label_type == Loop) {
      this_01 = (_anonymous_namespace_ *)pTVar3;
    }
    RVar2 = CheckSignature(this,(TypeVector *)this_01,"br_table");
    prefix = (char *)CONCAT71((int7)((ulong)pTVar3 >> 8),RVar2.enum_ == Error);
    this_00 = (_anonymous_namespace_ *)this->br_table_sig_;
    if (this_00 == (_anonymous_namespace_ *)0x0) {
      this->br_table_sig_ = (TypeVector *)this_01;
    }
    else if (*(long *)(this_00 + 8) - *(long *)this_00 != *(long *)(this_01 + 8) - *(long *)this_01)
    {
      (anonymous_namespace)::TypesToString_abi_cxx11_(&local_40,this_00,(TypeVector *)0x0,prefix);
      _Var1._M_p = local_40._M_dataplus._M_p;
      (anonymous_namespace)::TypesToString_abi_cxx11_(&local_60,this_01,(TypeVector *)0x0,prefix);
      PrintError(this,"br_table labels have inconsistent types: expected %s, got %s",_Var1._M_p,
                 local_60._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
      prefix = (char *)0x1;
    }
  }
  return (Result)((Enum)prefix & 0xff);
}

Assistant:

Result TypeChecker::OnBrTableTarget(Index depth) {
  Result result = Result::Ok;
  Label* label;
  CHECK_RESULT(GetLabel(depth, &label));
  TypeVector& label_sig = label->br_types();
  result |= CheckSignature(label_sig, "br_table");

  // Make sure this label's signature is consistent with the previous labels'
  // signatures.
  if (br_table_sig_ == nullptr) {
    br_table_sig_ = &label_sig;
  } else {
    if (br_table_sig_->size() != label_sig.size()) {
      result |= Result::Error;
      PrintError("br_table labels have inconsistent types: expected %s, got %s",
                 TypesToString(*br_table_sig_).c_str(),
                 TypesToString(label_sig).c_str());
    }
  }

  return result;
}